

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O2

void __thiscall icu_63::RBBIRuleScanner::~RBBIRuleScanner(RBBIRuleScanner *this)

{
  RBBINode *this_00;
  uint uVar1;
  void *in_RSI;
  long lVar2;
  
  this->_vptr_RBBIRuleScanner = (_func_int **)&PTR__RBBIRuleScanner_003aacb8;
  if (this->fSymbolTable != (RBBISymbolTable *)0x0) {
    (*(this->fSymbolTable->super_SymbolTable)._vptr_SymbolTable[1])();
  }
  if (this->fSetTable != (UHashtable *)0x0) {
    uhash_close_63(this->fSetTable);
    this->fSetTable = (UHashtable *)0x0;
  }
  uVar1 = this->fNodeStackPtr;
  while (0 < (int)uVar1) {
    this_00 = this->fNodeStack[uVar1];
    if (this_00 != (RBBINode *)0x0) {
      RBBINode::~RBBINode(this_00);
    }
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
    uVar1 = this->fNodeStackPtr - 1;
    this->fNodeStackPtr = uVar1;
  }
  lVar2 = 0;
  do {
    UnicodeSet::~UnicodeSet((UnicodeSet *)(&this->field_0x798 + lVar2));
    lVar2 = lVar2 + -0x58;
  } while (lVar2 != -0x370);
  UnicodeString::~UnicodeString(&this->fVarName);
  return;
}

Assistant:

RBBIRuleScanner::~RBBIRuleScanner() {
    delete fSymbolTable;
    if (fSetTable != NULL) {
         uhash_close(fSetTable);
         fSetTable = NULL;

    }


    // Node Stack.
    //   Normally has one entry, which is the entire parse tree for the rules.
    //   If errors occured, there may be additional subtrees left on the stack.
    while (fNodeStackPtr > 0) {
        delete fNodeStack[fNodeStackPtr];
        fNodeStackPtr--;
    }

}